

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::ipv6_peer::ipv6_peer(ipv6_peer *this,endpoint *ep,bool c,peer_source_flags_t src)

{
  unsigned_short port_;
  bytes_type bVar1;
  address local_60;
  address_v6 local_40;
  uchar local_22;
  byte local_21;
  endpoint *peStack_20;
  bool c_local;
  endpoint *ep_local;
  ipv6_peer *this_local;
  peer_source_flags_t src_local;
  
  local_21 = c;
  peStack_20 = ep;
  ep_local = (endpoint *)this;
  this_local._7_1_ = src.m_val;
  port_ = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(ep);
  local_22 = this_local._7_1_;
  torrent_peer::torrent_peer(&this->super_torrent_peer,port_,(bool)(local_21 & 1),this_local._7_1_);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_60,peStack_20);
  boost::asio::ip::address::to_v6(&local_40,&local_60);
  bVar1 = boost::asio::ip::address_v6::to_bytes(&local_40);
  *&(this->addr)._M_elems = bVar1._M_elems;
  *(uint *)&(this->super_torrent_peer).field_0x1b =
       *(uint *)&(this->super_torrent_peer).field_0x1b & 0xfeffffff | 0x1000000;
  *(uint *)&(this->super_torrent_peer).field_0x1b =
       *(uint *)&(this->super_torrent_peer).field_0x1b & 0xfdffffff;
  return;
}

Assistant:

ipv6_peer::ipv6_peer(tcp::endpoint const& ep, bool c
		, peer_source_flags_t const src)
		: torrent_peer(ep.port(), c, src)
		, addr(ep.address().to_v6().to_bytes())
	{
		is_v6_addr = true;
#if TORRENT_USE_I2P
		is_i2p_addr = false;
#endif
#if TORRENT_USE_RTC
		is_rtc_addr = false;
#endif
	}